

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O1

uint8_t * __thiscall
cdns::dump_block_parameters_storage
          (cdns *this,uint8_t *in,uint8_t *in_max,char *out_buf,char *out_max,int *err,FILE *F_out)

{
  byte bVar1;
  int64_t iVar2;
  byte *in_00;
  uint8_t *in_01;
  int iVar3;
  int64_t val;
  char *p_out;
  int64_t local_58;
  uint local_50 [2];
  char *local_48;
  long local_40;
  char *local_38;
  
  bVar1 = *in;
  local_38 = out_max;
  in_00 = cbor_get_number(in,in_max,&local_58);
  if (bVar1 >> 5 == 5 && in_00 != (byte *)0x0) {
    fwrite("[\n",2,1,(FILE *)F_out);
    iVar2 = local_58;
    if (local_58 == -1) {
      local_58 = 0xffffffff;
    }
    if ((in_00 < in_max) && (0 < local_58)) {
      local_40 = iVar2;
      iVar3 = 0;
      while (bVar1 = *in_00, bVar1 != 0xff) {
        in_01 = cbor_get_number(in_00,in_max,(int64_t *)local_50);
        if (bVar1 < 0x20) {
          if (iVar3 != 0) {
            fwrite(",\n",2,1,(FILE *)F_out);
          }
          iVar3 = iVar3 + 1;
          local_48 = out_buf;
          fprintf((FILE *)F_out,"                    %d,",(ulong)local_50[0]);
          in_00 = cbor_to_text(in_01,in_max,&local_48,local_38,err);
          fwrite(out_buf,1,(long)local_48 - (long)out_buf,(FILE *)F_out);
          local_58 = local_58 + -1;
        }
        else {
          fprintf((FILE *)F_out,"                    Unexpected type: %d(%d)\n",(ulong)(bVar1 >> 5),
                  (ulong)local_50[0]);
          *err = -3;
          in_00 = (byte *)0x0;
        }
        if (((in_max <= in_00) || (in_00 == (byte *)0x0)) || (local_58 < 1)) goto LAB_00177329;
      }
      if (local_40 == -1) {
        in_00 = in_00 + 1;
      }
      else {
        fwrite("                    Error, end of array mark unexpected.\n",0x39,1,(FILE *)F_out);
        *err = -3;
        in_00 = (byte *)0x0;
      }
    }
LAB_00177329:
    if (in_00 != (byte *)0x0) {
      fwrite("\n                ]",0x12,1,(FILE *)F_out);
    }
  }
  else {
    in_00 = (byte *)0x0;
    fprintf((FILE *)F_out,
            "       Error, cannot parse the first bytes of storage parameters (RFC), type %d.\n",
            (ulong)(bVar1 >> 5));
    *err = -3;
  }
  return in_00;
}

Assistant:

uint8_t* cdns::dump_block_parameters_storage(uint8_t* in, uint8_t* in_max, char* out_buf, char* out_max, int* err, FILE* F_out)
{
    char* p_out;
    int64_t val;
    int outer_type = CBOR_CLASS(*in);
    int is_undef = 0;

    in = cbor_get_number(in, in_max, &val);

    if (in != NULL && outer_type == CBOR_T_MAP) {
        int rank = 0;
        fprintf(F_out, "[\n");
        if (val == CBOR_END_OF_ARRAY) {
            is_undef = 1;
            val = 0xffffffff;
        }

        while (val > 0 && in != NULL && in < in_max) {
            if (*in == 0xff) {
                if (is_undef) {
                    in++;
                }
                else {
                    fprintf(F_out, "                    Error, end of array mark unexpected.\n");
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                break;
            }
            else {
                /* There should be two elements for each map item */
                int inner_type = CBOR_CLASS(*in);
                int64_t inner_val;

                in = cbor_get_number(in, in_max, &inner_val);
                if (inner_type != CBOR_T_UINT) {
                    fprintf(F_out, "                    Unexpected type: %d(%d)\n", inner_type, (int)inner_val);
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                else {
                    if (rank != 0) {
                        fprintf(F_out, ",\n");
                    }
                    rank++;
                    {
                        /* Type definitions copies from RFC */
                        p_out = out_buf;
                        fprintf(F_out, "                    %d,", (int)inner_val);
                        in = cbor_to_text(in, in_max, &p_out, out_max, err);
                        fwrite(out_buf, 1, p_out - out_buf, F_out);
                    }
                    val--;
                }
            }
        }


        if (in != NULL) {
            fprintf(F_out, "\n                ]");
        }
    }
    else {
        fprintf(F_out, "       Error, cannot parse the first bytes of storage parameters (RFC), type %d.\n", outer_type);
        *err = CBOR_MALFORMED_VALUE;
        in = NULL;
    }

    return in;
}